

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O1

HighsDebugStatus __thiscall HEkk::debugNonbasicMove(HEkk *this,HighsLp *pass_lp)

{
  char cVar1;
  HighsOptions *pHVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  HighsDebugStatus HVar8;
  pointer pdVar9;
  int iVar10;
  HighsLp *pHVar11;
  pointer pdVar12;
  HighsInt *pHVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  undefined4 uVar17;
  uint uVar18;
  int local_9c;
  double local_68;
  
  pHVar2 = this->options_;
  HVar8 = kNotChecked;
  if (1 < (pHVar2->super_HighsOptionsStruct).highs_debug_level) {
    pHVar11 = &this->lp_;
    if (pass_lp != (HighsLp *)0x0) {
      pHVar11 = pass_lp;
    }
    pHVar13 = &(this->lp_).num_row_;
    if (pass_lp != (HighsLp *)0x0) {
      pHVar13 = &pass_lp->num_row_;
    }
    lVar16 = (long)pHVar11->num_col_;
    uVar14 = *pHVar13 + pHVar11->num_col_;
    iVar7 = 0;
    HVar8 = kOk;
    if (uVar14 != *(int *)&(this->basis_).nonbasicMove_.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                  *(int *)&(this->basis_).nonbasicMove_.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_start) {
      highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,"nonbasicMove size error\n"
                 );
      HVar8 = kLogicalError;
    }
    iVar6 = 0;
    iVar5 = 0;
    iVar10 = 0;
    local_9c = 0;
    if (0 < (int)uVar14) {
      uVar15 = 0;
      local_9c = 0;
      iVar10 = 0;
      iVar5 = 0;
      iVar6 = 0;
      iVar7 = 0;
      do {
        if ((this->basis_).nonbasicFlag_.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] != '\0') {
          if (pass_lp == (HighsLp *)0x0) {
            if (lVar16 <= (long)uVar15) {
              local_68 = (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar15 - lVar16];
              pdVar9 = (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              goto LAB_0034dbe0;
            }
            pdVar9 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar12 = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
LAB_0034db89:
            local_68 = pdVar9[uVar15];
            uVar17 = SUB84(pdVar12[uVar15],0);
            uVar18 = (uint)((ulong)pdVar12[uVar15] >> 0x20);
          }
          else {
            if ((long)uVar15 < lVar16) {
              pdVar9 = (pass_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar12 = (pass_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              goto LAB_0034db89;
            }
            local_68 = (pass_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar15 - lVar16];
            pdVar9 = (pass_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
LAB_0034dbe0:
            local_68 = -local_68;
            uVar17 = SUB84(pdVar9[uVar15 - lVar16],0);
            uVar18 = (uint)((ulong)pdVar9[uVar15 - lVar16] >> 0x20) ^ 0x80000000;
          }
          bVar3 = highs_isInfinity((double)CONCAT44(uVar18,uVar17));
          bVar4 = highs_isInfinity(-local_68);
          if (bVar3) {
            cVar1 = (this->basis_).nonbasicMove_.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15];
            if (bVar4) {
              local_9c = (local_9c + 1) - (uint)(cVar1 == '\0');
            }
            else {
              iVar10 = iVar10 + (uint)(cVar1 != '\x01');
            }
          }
          else if (bVar4) {
            iVar5 = iVar5 + (uint)((this->basis_).nonbasicMove_.
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar15] != -1);
          }
          else {
            cVar1 = (this->basis_).nonbasicMove_.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15];
            if ((local_68 != (double)CONCAT44(uVar18,uVar17)) ||
               (NAN(local_68) || NAN((double)CONCAT44(uVar18,uVar17)))) {
              iVar6 = iVar6 + (uint)(cVar1 == '\0');
            }
            else {
              iVar7 = (iVar7 + 1) - (uint)(cVar1 == '\0');
            }
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    if (iVar5 + iVar10 + iVar6 + iVar7 + local_9c != 0) {
      highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,
                  "There are %d nonbasicMove errors: %d free; %d lower; %d upper; %d boxed; %d fixed\n"
                 );
      HVar8 = kLogicalError;
    }
  }
  return HVar8;
}

Assistant:

HighsDebugStatus HEkk::debugNonbasicMove(const HighsLp* pass_lp) const {
  // Non-trivially expensive check of NonbasicMove
  if (this->options_->highs_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const HighsOptions& options = *(this->options_);
  const SimplexBasis& basis = this->basis_;
  HighsInt num_free_variable_move_errors = 0;
  HighsInt num_lower_bounded_variable_move_errors = 0;
  HighsInt num_upper_bounded_variable_move_errors = 0;
  HighsInt num_boxed_variable_move_errors = 0;
  HighsInt num_fixed_variable_move_errors = 0;
  HighsInt num_col;
  HighsInt num_row;
  const bool use_pass_lp = (pass_lp != nullptr);
  if (use_pass_lp) {
    num_col = pass_lp->num_col_;
    num_row = pass_lp->num_row_;
  } else {
    assert(1 == 0);
    num_col = this->lp_.num_col_;
    num_row = this->lp_.num_row_;
  }

  const HighsInt numTot = num_col + num_row;
  bool right_size = (HighsInt)basis.nonbasicMove_.size() == numTot;
  // Check consistency of nonbasicMove
  if (!right_size) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicMove size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  double lower;
  double upper;

  for (HighsInt iVar = 0; iVar < numTot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    // Nonbasic variable
    if (use_pass_lp) {
      if (iVar < num_col) {
        lower = pass_lp->col_lower_[iVar];
        upper = pass_lp->col_upper_[iVar];
      } else {
        HighsInt iRow = iVar - num_col;
        lower = -pass_lp->row_upper_[iRow];
        upper = -pass_lp->row_lower_[iRow];
      }
    } else {
      if (iVar < num_col) {
        lower = this->lp_.col_lower_[iVar];
        upper = this->lp_.col_upper_[iVar];
      } else {
        HighsInt iRow = iVar - num_col;
        lower = -this->lp_.row_upper_[iRow];
        upper = -this->lp_.row_lower_[iRow];
      }
    }

    if (highs_isInfinity(upper)) {
      if (highs_isInfinity(-lower)) {
        // Free
        if (basis.nonbasicMove_[iVar]) {
          num_free_variable_move_errors++;
        }
      } else {
        // Only lower bounded
        if (basis.nonbasicMove_[iVar] != kNonbasicMoveUp) {
          num_lower_bounded_variable_move_errors++;
        }
      }
    } else {
      if (highs_isInfinity(-lower)) {
        // Only upper bounded
        if (basis.nonbasicMove_[iVar] != kNonbasicMoveDn) {
          num_upper_bounded_variable_move_errors++;
        }
      } else {
        // Boxed or fixed
        if (lower != upper) {
          // Boxed
          if (!basis.nonbasicMove_[iVar]) {
            num_boxed_variable_move_errors++;
          }
        } else {
          // Fixed
          if (basis.nonbasicMove_[iVar]) {
            num_fixed_variable_move_errors++;
          }
        }
      }
    }
  }
  HighsInt num_errors =
      num_free_variable_move_errors + num_lower_bounded_variable_move_errors +
      num_upper_bounded_variable_move_errors + num_boxed_variable_move_errors +
      num_fixed_variable_move_errors;

  if (num_errors) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "There are %" HIGHSINT_FORMAT
                " nonbasicMove errors: %" HIGHSINT_FORMAT
                " free; %" HIGHSINT_FORMAT " lower; %" HIGHSINT_FORMAT
                " upper; %" HIGHSINT_FORMAT
                " "
                "boxed; %" HIGHSINT_FORMAT " fixed\n",
                num_errors, num_free_variable_move_errors,
                num_lower_bounded_variable_move_errors,
                num_upper_bounded_variable_move_errors,
                num_boxed_variable_move_errors, num_fixed_variable_move_errors);
    assert(num_errors == 0);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}